

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O0

RotationalInertia * __thiscall
iDynTree::SpatialInertia::getRotationalInertiaWrtCenterOfMass(SpatialInertia *this)

{
  double *dataPtr;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
  *other;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_RSI;
  Stride<0,_0> *in_RDI;
  Vector3d *in_stack_00000048;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> mcom;
  Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> comInertia;
  Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> linkInertia;
  RotationalInertia *retComInertia;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>_>
  *in_stack_fffffffffffffeb8;
  Stride<0,_0> *this_00;
  double *in_stack_ffffffffffffff00;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffff08;
  
  this_00 = in_RDI;
  RotationalInertia::RotationalInertia((RotationalInertia *)0x6f3c06);
  dataPtr = MatrixFixSize<3U,_3U>::data((MatrixFixSize<3U,_3U> *)(in_RSI + 0x20));
  Eigen::Stride<0,_0>::Stride(in_RDI);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)this_00,
             dataPtr,in_RDI);
  MatrixFixSize<3U,_3U>::data((MatrixFixSize<3U,_3U> *)this_00);
  Eigen::Stride<0,_0>::Stride(in_RDI);
  Eigen::Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)this_00,dataPtr,
             in_RDI);
  other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
           *)(in_RSI + 8);
  Eigen::Stride<0,_0>::Stride(in_RDI);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_00,
             dataPtr,in_RDI);
  if (ABS(*(double *)in_RSI) <= 0.0) {
    Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
               (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffeb8);
  }
  else {
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_RDI,
               (EigenBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffeb8);
    squareCrossProductMatrix(in_stack_00000048);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator/
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>>::
    operator+(in_RSI,other);
    Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
               in_stack_fffffffffffffeb8);
  }
  return (RotationalInertia *)in_RDI;
}

Assistant:

RotationalInertia SpatialInertia::getRotationalInertiaWrtCenterOfMass() const
{
    RotationalInertia retComInertia;
    // Here we need to compute the rotational inertia at the com
    // given the one expressed at the frame origin
    // we apply formula 2.63 in Featherstone 2008
    Eigen::Map<const Eigen::Matrix3d> linkInertia(this->m_rotInertia.data());
    Eigen::Map<Eigen::Matrix3d> comInertia(retComInertia.data());
    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);

    if( fabs(this->m_mass) > 0 )
    {
        comInertia = linkInertia + squareCrossProductMatrix(mcom)/this->m_mass;
    }
    else
    {
        comInertia = linkInertia;
    }

    return retComInertia;
}